

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O2

void * worker_thread_test_evict_by_key(void *arg)

{
  uint uVar1;
  int iVar2;
  ulong local_30;
  
  uVar1 = *(uint *)((long)arg + 4);
  for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
    vmemcache_evict(*(undefined8 *)((long)arg + 8),&local_30,8);
  }
  do {
    iVar2 = vmemcache_evict(*(undefined8 *)((long)arg + 8),0,0);
  } while (iVar2 == 0);
  LOCK();
  keep_running = 0;
  UNLOCK();
  return (void *)0x0;
}

Assistant:

static void *
worker_thread_test_evict_by_key(void *arg)
{
	struct context *ctx = arg;
	unsigned n_threads = ctx->n_threads;

	/*
	 * Try to evict all entries by key first.
	 * It is very likely that even all of these vmemcache_evict() calls
	 * will fail, because the conditions are extremely difficult (all cache
	 * entries are being constantly read (used) by separate threads),
	 * but this is acceptable, because this test is dedicated
	 * to test the failure path of vmemcache_evict()
	 * and the success criteria of this test are checks done in free_cache()
	 * at the end of the test.
	 */
	for (unsigned long long  n = 0; n < n_threads; ++n)
		vmemcache_evict(ctx->cache, &n, sizeof(n));

	/* try to evict by LRU all entries that were not evicted above */
	while (vmemcache_evict(ctx->cache, NULL, 0) == 0)
		;

	__atomic_store_n(&keep_running, 0, __ATOMIC_SEQ_CST);

	return NULL;
}